

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O3

int __thiscall
QHttpNetworkConnectionPrivate::indexOf(QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  long lVar1;
  long lVar2;
  long extraout_RAX;
  QIODevice **ppQVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < (long)this->activeChannelCount) {
    ppQVar3 = &this->channels->socket;
    lVar2 = 0;
    do {
      if (*ppQVar3 == socket) goto LAB_001fe295;
      lVar2 = lVar2 + 1;
      ppQVar3 = ppQVar3 + 0x21;
    } while (this->activeChannelCount != lVar2);
  }
  indexOf();
  lVar2 = extraout_RAX;
LAB_001fe295:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)lVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QHttpNetworkConnectionPrivate::indexOf(QIODevice *socket) const
{
    for (int i = 0; i < activeChannelCount; ++i)
        if (channels[i].socket == socket)
            return i;

    qFatal("Called with unknown socket object.");
    return 0;
}